

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file_00;
  Symbol SVar2;
  DescriptorBuilder *pDVar3;
  bool bVar4;
  undefined7 extraout_var;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  anon_union_8_8_13f84498_for_Symbol_2 extraout_RDX;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar7;
  Symbol SVar8;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar9;
  undefined1 auVar10 [16];
  Symbol result;
  FileDescriptor *file;
  Type local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  FileDescriptor *local_30;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  
  SVar8 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_38 = SVar8.field_1;
  local_40 = SVar8.type;
  if (local_40 == NULL_SYMBOL) {
    auVar13._0_4_ = SVar8.type;
    auVar17._4_4_ = SVar8._4_4_;
    register0x00000010 = SVar8.field_1;
    return (Symbol)auVar13;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    auVar12._0_4_ = SVar8.type;
    auVar16._4_4_ = SVar8._4_4_;
    register0x00000010 = SVar8.field_1;
    return (Symbol)auVar12;
  }
  this_00 = (DescriptorBuilder *)&stack0xffffffffffffffc0;
  local_30 = Symbol::GetFile((Symbol *)this_00);
  if (local_30 != this->file_) {
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(long)this_00]) {
      this_00 = (DescriptorBuilder *)(ulong)(*(FileDescriptor **)(p_Var6 + 1) < local_30);
      if (*(FileDescriptor **)(p_Var6 + 1) >= local_30) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, local_30 < *(FileDescriptor **)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      if (local_40 != PACKAGE) {
LAB_005883d2:
        this->possible_undeclared_dependency_ = local_30;
        std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
        auVar10._0_4_ = NULL_SYMBOL;
        auVar14._4_4_ = 0;
        register0x00000010 = (anon_union_8_8_13f84498_for_Symbol_2)0x0;
        return (Symbol)auVar10;
      }
      bVar4 = IsInPackage(this_00,this->file_,name);
      SVar8._1_7_ = extraout_var;
      SVar8.type._0_1_ = bVar4;
      SVar8.field_1.descriptor = extraout_RDX.descriptor;
      if (!bVar4) {
        pDVar3 = (DescriptorBuilder *)
                 (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (pDVar7 = pDVar3, pDVar7 != (DescriptorBuilder *)p_Var1) {
          file_00 = (pDVar7->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((file_00 != (pointer)0x0) &&
             (bVar4 = IsInPackage(this_00,(FileDescriptor *)file_00,name), bVar4)) {
            SVar8._4_4_ = 0;
            SVar8.type = local_40;
            SVar8.field_1.descriptor = local_38.descriptor;
            break;
          }
          SVar8 = (Symbol)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar7);
          this_00 = pDVar7;
          pDVar3 = SVar8._0_8_;
        }
        if (pDVar7 != (DescriptorBuilder *)p_Var1) {
          auVar11._0_4_ = SVar8.type;
          auVar15._4_4_ = SVar8._4_4_;
          register0x00000010 = SVar8.field_1;
          return (Symbol)auVar11;
        }
        goto LAB_005883d2;
      }
      goto LAB_0058835d;
    }
  }
  pVar9 = std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::equal_range(&(this->unused_dependency_)._M_t,&stack0xffffffffffffffd0);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::_M_erase_aux(&(this->unused_dependency_)._M_t,(_Base_ptr)pVar9.first._M_node,
                 (_Base_ptr)pVar9.second._M_node);
LAB_0058835d:
  SVar2._4_4_ = 0;
  SVar2.type = local_40;
  SVar2.field_1.descriptor = local_38.descriptor;
  return SVar2;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}